

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::GetErrorTag_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,unsigned_long number)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,ErrorTag + number * 4,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetErrorTag(unsigned long number) const
{
  return ErrorTag[number];
}